

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

bool __thiscall
QListModeViewBase::dropOn
          (QListModeViewBase *this,QDropEvent *event,int *dropRow,int *dropCol,
          QModelIndex *dropIndex)

{
  bool bVar1;
  Int IVar2;
  DropIndicatorPosition DVar3;
  ulong uVar4;
  qsizetype qVar5;
  QModelIndex *pQVar6;
  int *in_RCX;
  int *in_RDX;
  QEvent *in_RSI;
  QRect *in_RDI;
  QListModeViewBase *in_R8;
  long in_FS_OFFSET;
  int col;
  int row;
  QList<QModelIndex> intersectVector;
  QRect rect;
  QPoint p;
  QModelIndex index;
  int in_stack_fffffffffffffe78;
  DropAction in_stack_fffffffffffffe7c;
  QModelIndex *in_stack_fffffffffffffe80;
  QRect *in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  int in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  int in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  int iVar7;
  int iVar8;
  bool local_119;
  QPersistentModelIndexData *local_118;
  QListViewPrivate *local_110;
  QAbstractItemModel *local_108;
  QPersistentModelIndexData *local_100;
  QListViewPrivate *local_f8;
  QAbstractItemModel *local_f0;
  QFlagsStorageHelper<Qt::DropAction,_4> local_bc;
  QPersistentModelIndex local_b8;
  QListViewPrivate *local_b0;
  QAbstractItemModel *local_a8;
  QPersistentModelIndexData *local_a0;
  QListViewPrivate *local_98;
  QAbstractItemModel *local_90;
  QList<QModelIndex> local_88;
  undefined1 *local_70;
  undefined1 *local_68;
  QPointF local_60;
  QPoint local_50;
  QPointF local_48;
  QPoint local_38;
  QRect local_30;
  QPersistentModelIndexData *local_20;
  QListViewPrivate *local_18;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QEvent::isAccepted(in_RSI);
  if (bVar1) {
    local_119 = false;
  }
  else {
    local_20 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    local_18 = (QListViewPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_10.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::QModelIndex((QModelIndex *)0x880233);
    local_30 = QWidget::rect((QWidget *)
                             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    local_48 = QDropEvent::position((QDropEvent *)in_stack_fffffffffffffe88);
    local_38 = QPointF::toPoint((QPointF *)
                                CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    uVar4 = QRect::contains((QPoint *)&local_30,SUB81(&local_38,0));
    if ((uVar4 & 1) != 0) {
      local_50 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      local_60 = QDropEvent::position((QDropEvent *)in_stack_fffffffffffffe88);
      local_50 = QPointF::toPoint((QPointF *)
                                  CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      local_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      in_stack_fffffffffffffe90 = QPoint::x((QPoint *)0x880314);
      in_stack_fffffffffffffe98 = (**(code **)(*(long *)in_RDI + 0x68))();
      in_stack_fffffffffffffe98 = in_stack_fffffffffffffe90 + in_stack_fffffffffffffe98;
      in_stack_fffffffffffffe94 = QPoint::y((QPoint *)0x88033c);
      (**(code **)(*(long *)in_RDI + 0x70))();
      QRect::QRect(in_stack_fffffffffffffe88,(int)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                   (int)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                   in_stack_fffffffffffffe78);
      in_stack_fffffffffffffe9c = QListViewPrivate::spacing(*(QListViewPrivate **)&in_RDI->x2);
      in_stack_fffffffffffffe9c = -in_stack_fffffffffffffe9c;
      in_stack_fffffffffffffea0 = QListViewPrivate::spacing(*(QListViewPrivate **)&in_RDI->x2);
      in_stack_fffffffffffffea0 = -in_stack_fffffffffffffea0;
      in_stack_fffffffffffffea4 = QListViewPrivate::spacing(*(QListViewPrivate **)&in_RDI->x2);
      QListViewPrivate::spacing(*(QListViewPrivate **)&in_RDI->x2);
      QRect::adjust((QRect *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                    (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),(int)in_stack_fffffffffffffe88,
                    (int)((ulong)in_stack_fffffffffffffe80 >> 0x20),(int)in_stack_fffffffffffffe80);
      local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QListViewPrivate::intersectingSet
                ((QListViewPrivate *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 (QRect *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 SUB41((uint)in_stack_fffffffffffffe94 >> 0x18,0));
      qVar5 = QList<QModelIndex>::size(&local_88);
      if (qVar5 < 1) {
        QModelIndex::QModelIndex((QModelIndex *)0x88047b);
      }
      else {
        pQVar6 = QList<QModelIndex>::last
                           ((QList<QModelIndex> *)
                            CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        local_a0 = *(QPersistentModelIndexData **)pQVar6;
        local_98 = (QListViewPrivate *)pQVar6->i;
        local_90 = (pQVar6->m).ptr;
      }
      local_20 = local_a0;
      local_18 = local_98;
      local_10.ptr = local_90;
      bVar1 = QModelIndex::isValid(in_stack_fffffffffffffe80);
      if (!bVar1) {
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_b8);
        local_20 = local_b8.d;
        local_18 = local_b0;
        local_10.ptr = local_a8;
      }
      QList<QModelIndex>::~QList((QList<QModelIndex> *)0x880516);
    }
    (**(code **)(**(long **)(*(long *)&in_RDI->x2 + 0x2f8) + 0xe8))();
    QDropEvent::dropAction((QDropEvent *)in_RSI);
    local_bc.super_QFlagsStorage<Qt::DropAction>.i =
         (QFlagsStorage<Qt::DropAction>)
         QFlags<Qt::DropAction>::operator&
                   ((QFlags<Qt::DropAction> *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_bc);
    if (IVar2 != 0) {
      iVar8 = -1;
      iVar7 = -1;
      bVar1 = ::operator!=(in_stack_fffffffffffffe80,
                           (QPersistentModelIndex *)
                           CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      if (bVar1) {
        QDropEvent::position((QDropEvent *)in_stack_fffffffffffffe88);
        QPointF::toPoint((QPointF *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
        (**(code **)(**(long **)(in_RDI + 1) + 0x1e0))();
        DVar3 = position(in_R8,(QPoint *)CONCAT44(iVar8,iVar7),in_RDI,
                         (QModelIndex *)
                         CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
        *(DropIndicatorPosition *)(*(long *)&in_RDI->x2 + 1000) = DVar3;
        switch(*(undefined4 *)(*(long *)&in_RDI->x2 + 1000)) {
        case 0:
        case 3:
          break;
        case 1:
          iVar8 = QModelIndex::row((QModelIndex *)&local_20);
          iVar7 = QModelIndex::column((QModelIndex *)&local_20);
          QModelIndex::parent((QModelIndex *)
                              CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
          local_20 = local_100;
          local_18 = local_f8;
          local_10.ptr = local_f0;
          break;
        case 2:
          iVar8 = QModelIndex::row((QModelIndex *)&local_20);
          iVar8 = iVar8 + 1;
          iVar7 = QModelIndex::column((QModelIndex *)&local_20);
          QModelIndex::parent((QModelIndex *)
                              CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
          local_20 = local_118;
          local_18 = local_110;
          local_10.ptr = local_108;
        }
      }
      else {
        *(undefined4 *)(*(long *)&in_RDI->x2 + 1000) = 3;
      }
      (in_R8->super_QCommonListViewBase)._vptr_QCommonListViewBase = (_func_int **)local_20;
      (in_R8->super_QCommonListViewBase).dd = local_18;
      (in_R8->super_QCommonListViewBase).qq = (QListView *)local_10.ptr;
      *in_RDX = iVar8;
      *in_RCX = iVar7;
      bVar1 = QAbstractItemViewPrivate::droppingOnItself
                        ((QAbstractItemViewPrivate *)
                         CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                         (QDropEvent *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)
                         ,(QModelIndex *)
                          CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      if (!bVar1) {
        local_119 = true;
        goto LAB_008807b5;
      }
    }
    local_119 = false;
  }
LAB_008807b5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_119;
}

Assistant:

bool QListModeViewBase::dropOn(QDropEvent *event, int *dropRow, int *dropCol, QModelIndex *dropIndex)
{
    if (event->isAccepted())
        return false;

    QModelIndex index;
    if (dd->viewport->rect().contains(event->position().toPoint())) {
        // can't use indexAt, doesn't account for spacing.
        QPoint p = event->position().toPoint();
        QRect rect(p.x() + horizontalOffset(), p.y() + verticalOffset(), 1, 1);
        rect.adjust(-dd->spacing(), -dd->spacing(), dd->spacing(), dd->spacing());
        const QList<QModelIndex> intersectVector = dd->intersectingSet(rect);
        index = intersectVector.size() > 0
            ? intersectVector.last() : QModelIndex();
        if (!index.isValid())
            index = dd->root;
    }

    // If we are allowed to do the drop
    if (dd->model->supportedDropActions() & event->dropAction()) {
        int row = -1;
        int col = -1;
        if (index != dd->root) {
            dd->dropIndicatorPosition = position(event->position().toPoint(), qq->visualRect(index), index);
            switch (dd->dropIndicatorPosition) {
            case QAbstractItemView::AboveItem:
                row = index.row();
                col = index.column();
                index = index.parent();
                break;
            case QAbstractItemView::BelowItem:
                row = index.row() + 1;
                col = index.column();
                index = index.parent();
                break;
            case QAbstractItemView::OnItem:
            case QAbstractItemView::OnViewport:
                break;
            }
        } else {
            dd->dropIndicatorPosition = QAbstractItemView::OnViewport;
        }
        *dropIndex = index;
        *dropRow = row;
        *dropCol = col;
        if (!dd->droppingOnItself(event, index))
            return true;
    }
    return false;
}